

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkTopmost(Abc_Ntk_t *pNtk,int nLevels)

{
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int LevelCut;
  Abc_Obj_t *pObjPo;
  Abc_Obj_t *pObjNew;
  Abc_Ntk_t *pNtkNew;
  int nLevels_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x229,"Abc_Ntk_t *Abc_NtkTopmost(Abc_Ntk_t *, int)");
  }
  iVar1 = Abc_NtkCoNum(pNtk);
  if (iVar1 != 1) {
    __assert_fail("Abc_NtkCoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x22a,"Abc_Ntk_t *Abc_NtkTopmost(Abc_Ntk_t *, int)");
  }
  iVar1 = Abc_AigLevel(pNtk);
  iVar1 = Abc_MaxInt(0,iVar1 - nLevels);
  pNtk_local = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar2 = Extra_UtilStrsav(pNtk->pName);
  pNtk_local->pName = pcVar2;
  pAVar3 = Abc_AigConst1(pNtk_local);
  pAVar4 = Abc_AigConst1(pNtk);
  (pAVar4->field_6).pCopy = pAVar3;
  Abc_NtkCleanCopy(pNtk);
  pAVar3 = Abc_NtkPo(pNtk,0);
  pAVar3 = Abc_ObjFanin0(pAVar3);
  pAVar3 = Abc_NtkTopmost_rec(pNtk_local,pAVar3,iVar1);
  pAVar4 = Abc_NtkPo(pNtk,0);
  iVar1 = Abc_ObjFaninC0(pAVar4);
  pAVar3 = Abc_ObjNotCond(pAVar3,iVar1);
  pAVar4 = Abc_NtkCreatePo(pNtk_local);
  Abc_ObjAddFanin(pAVar4,pAVar3);
  Abc_NtkAddDummyPiNames(pNtk_local);
  pAVar3 = Abc_NtkPo(pNtk,0);
  pcVar2 = Abc_ObjName(pAVar3);
  Abc_ObjAssignName(pAVar4,pcVar2,(char *)0x0);
  iVar1 = Abc_NtkCheck(pNtk_local);
  if (iVar1 == 0) {
    printf("Abc_NtkTopmost: The network check has failed.\n");
    Abc_NtkDelete(pNtk_local);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkTopmost( Abc_Ntk_t * pNtk, int nLevels )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pObjPo;
    int LevelCut;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkCoNum(pNtk) == 1 );
    // get the cutoff level
    LevelCut = Abc_MaxInt( 0, Abc_AigLevel(pNtk) - nLevels );
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // create PIs below the cut and nodes above the cut
    Abc_NtkCleanCopy( pNtk );
    pObjNew = Abc_NtkTopmost_rec( pNtkNew, Abc_ObjFanin0(Abc_NtkPo(pNtk, 0)), LevelCut );
    pObjNew = Abc_ObjNotCond( pObjNew, Abc_ObjFaninC0(Abc_NtkPo(pNtk, 0)) );
    // add the PO node and name
    pObjPo = Abc_NtkCreatePo(pNtkNew);
    Abc_ObjAddFanin( pObjPo, pObjNew );
    Abc_NtkAddDummyPiNames( pNtkNew );
    Abc_ObjAssignName( pObjPo, Abc_ObjName(Abc_NtkPo(pNtk, 0)), NULL );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkTopmost: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}